

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_cte.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::ExtractCTEsRecursive(Transformer *this,CommonTableExpressionMap *cte_map)

{
  pointer ppCVar1;
  pointer ppVar2;
  pointer __p;
  iterator iVar3;
  __uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
  *this_00;
  Transformer *this_01;
  pointer key;
  pointer ppCVar4;
  pointer local_40;
  Transformer *local_38;
  
  ppCVar1 = (this->stored_cte_map).
            super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
            .
            super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (ppCVar4 = (this->stored_cte_map).
                 super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
                 .
                 super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
      ppCVar4 = ppCVar4 + 1) {
    ppVar2 = ((*ppCVar4)->map).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (key = ((*ppCVar4)->map).map.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; key != ppVar2; key = key + 1) {
      iVar3 = InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
              ::find(&cte_map->map,&key->first);
      if (iVar3._M_current ==
          (cte_map->map).map.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
        ::operator->(&key->second);
        CommonTableExpressionInfo::Copy((CommonTableExpressionInfo *)&local_40);
        this_00 = (__uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                   *)InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                     ::operator[](&cte_map->map,&key->first);
        __p = local_40;
        local_40 = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
        ::reset(this_00,__p);
        ::std::
        unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
        ::~unique_ptr((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>_>
                       *)&local_40);
      }
    }
  }
  if ((local_38->parent).ptr != (Transformer *)0x0) {
    this_01 = optional_ptr<duckdb::Transformer,_true>::operator->(&local_38->parent);
    ExtractCTEsRecursive(this_01,cte_map);
  }
  return;
}

Assistant:

void Transformer::ExtractCTEsRecursive(CommonTableExpressionMap &cte_map) {
	for (auto &cte_entry : stored_cte_map) {
		for (auto &entry : cte_entry->map) {
			auto found_entry = cte_map.map.find(entry.first);
			if (found_entry != cte_map.map.end()) {
				// entry already present - use top-most entry
				continue;
			}
			cte_map.map[entry.first] = entry.second->Copy();
		}
	}
	if (parent) {
		parent->ExtractCTEsRecursive(cte_map);
	}
}